

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extract.hpp
# Opt level: O1

extraction_result_t * __thiscall
bredis::extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::operator()
          (extraction_result_t *__return_storage_ptr__,
          extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,
          int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  bool bVar1;
  string str;
  i_interpreter_type i_interpreter;
  type local_68;
  type_info_t *local_60;
  long local_58;
  type_info_t local_50 [16];
  undefined **local_40;
  type_info_t *local_38;
  type_info_t *local_30;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_28;
  
  local_58 = 0;
  local_50[0] = (type_info_t)0x0;
  local_60 = local_50;
  std::__cxx11::string::reserve((ulong)&local_60);
  std::__cxx11::string::
  _M_replace_dispatch<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
            ((string *)&local_60,local_60 + local_58);
  local_68 = (type)0x0;
  local_38 = local_60;
  local_30 = local_60 + local_58;
  local_28.start = (char *)local_60;
  local_28.finish = (char *)local_30;
  bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
          shr_signed<long>(&local_28,(long *)&local_68);
  if (bVar1) {
    (__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_.align_ = local_68;
    __return_storage_ptr__->which_ = 0;
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    return __return_storage_ptr__;
  }
  local_40 = &PTR__bad_cast_001abac0;
  local_38 = (type_info_t *)&std::__cxx11::string::typeinfo;
  local_30 = (type_info_t *)&long::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_40);
}

Assistant:

extracts::extraction_result_t
    operator()(const markers::int_t<Iterator> &value) const {
        std::string str;
        auto size = std::distance(value.string.from, value.string.to);
        str.reserve(size);
        str.append(value.string.from, value.string.to);
        return extracts::int_t{boost::lexical_cast<extracts::int_t>(str)};
    }